

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_graph_quantity.cpp
# Opt level: O0

string * __thiscall polyscope::SurfaceGraphQuantity::niceName_abi_cxx11_(SurfaceGraphQuantity *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x10));
  return in_RDI;
}

Assistant:

std::string SurfaceGraphQuantity::niceName() { return name; }